

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O0

void SpiritKarma<unsigned_int>(void)

{
  _Setprecision _Var1;
  ostream *poVar2;
  char *pcVar3;
  rep rVar4;
  ResultType *local_78;
  char *beg;
  undefined1 local_68 [4];
  uint i;
  Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> _prof;
  uint _imax;
  uint _imin;
  ResultType _result;
  char buf [64];
  
  poVar2 = std::operator<<((ostream *)&std::cout,"[");
  pcVar3 = std::type_info::name((type_info *)&unsigned_int::typeinfo);
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2,"] ");
  poVar2 = std::operator<<(poVar2,"spirit karma");
  poVar2 = std::operator<<(poVar2,"... ");
  std::ostream::operator<<(poVar2,std::flush<char,std::char_traits<char>>);
  _prof.mStart.__d.__r._4_4_ = 0;
  _prof.mStart.__d.__r._0_4_ = 0xffffffff;
  Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>::Profiler
            ((Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> *)local_68,
             (duration<double,_std::ratio<1L,_1L>_> *)&_imax);
  for (beg._4_4_ = 0; beg._4_4_ != -1; beg._4_4_ = beg._4_4_ + 1) {
    local_78 = &_result;
    boost::spirit::karma::
    generate<char*,boost::spirit::terminal<boost::spirit::tag::auto_>,unsigned_int>
              ((char **)&local_78,(terminal<boost::spirit::tag::auto_> *)&boost::spirit::auto_,
               (uint *)((long)&beg + 4));
    *(undefined1 *)&local_78->__r = 0;
  }
  Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>::~Profiler
            ((Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> *)local_68);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,std::fixed);
  _Var1 = std::setprecision(3);
  poVar2 = std::operator<<(poVar2,_Var1);
  rVar4 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count
                    ((duration<double,_std::ratio<1L,_1L>_> *)&_imax);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,rVar4);
  poVar2 = std::operator<<(poVar2,"s");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void SpiritKarma()
{
    char buf[64];
    PROFILING_BEGIN(T, "spirit karma")
    char *beg = buf;
    boost::spirit::karma::generate(beg, boost::spirit::karma::auto_, i);
    *beg = 0;
    PROFILING_END()
}